

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::PrepareInsertionPoint
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *funcInfo,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Opnd *this_01;
  RegOpnd *newSrc;
  intptr_t address;
  AddrOpnd *newSrc_00;
  AddrOpnd *inlinedFuncInfo;
  Instr *checkFuncInfo;
  Instr *insertBeforeInstr_local;
  FunctionJITTimeInfo *funcInfo_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x11df,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (insertBeforeInstr->m_func != callInstr->m_func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x11e0,"(insertBeforeInstr->m_func == callInstr->m_func)",
                       "insertBeforeInstr->m_func == callInstr->m_func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (CheckFuncInfo,BailOutOnInlineFunction,insertBeforeInstr,callInstr->m_func);
  this_01 = IR::Instr::GetSrc1(callInstr);
  newSrc = IR::Opnd::AsRegOpnd(this_01);
  IR::Instr::SetSrc1(&this_00->super_Instr,&newSrc->super_Opnd);
  address = FunctionJITTimeInfo::GetFunctionInfoAddr(funcInfo);
  newSrc_00 = IR::AddrOpnd::New(address,AddrOpndKindDynamicFunctionInfo,insertBeforeInstr->m_func,
                                false,(Var)0x0);
  IR::Instr::SetSrc2(&this_00->super_Instr,&newSrc_00->super_Opnd);
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,insertBeforeInstr);
  IR::Instr::InsertBefore(insertBeforeInstr,&this_00->super_Instr);
  IR::Instr::ShareBailOut(&this_00->super_Instr);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
Inline::PrepareInsertionPoint(IR::Instr *callInstr, const FunctionJITTimeInfo *funcInfo, IR::Instr *insertBeforeInstr)
{
    Assert(insertBeforeInstr);
    Assert(insertBeforeInstr->m_func == callInstr->m_func);

    IR::Instr* checkFuncInfo = IR::BailOutInstr::New(Js::OpCode::CheckFuncInfo, IR::BailOutOnInlineFunction, insertBeforeInstr, callInstr->m_func);
    checkFuncInfo->SetSrc1(callInstr->GetSrc1()->AsRegOpnd());

    IR::AddrOpnd* inlinedFuncInfo = IR::AddrOpnd::New(funcInfo->GetFunctionInfoAddr(), IR::AddrOpndKindDynamicFunctionInfo, insertBeforeInstr->m_func);
    checkFuncInfo->SetSrc2(inlinedFuncInfo);

    checkFuncInfo->SetByteCodeOffset(insertBeforeInstr);
    insertBeforeInstr->InsertBefore(checkFuncInfo);

    // checkFuncInfo can be hoisted later and then have its BailOutInfo garbage collected. Other instructions (ex: BailOnNotStackArgs) share
    // checkFuncInfo's BailOutInfo. Explicitly force sharedBailOutKind to be true to stop this BailOutInfo from being garbage collected.
    checkFuncInfo->ShareBailOut();

    return checkFuncInfo;
}